

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::Mesh::reduce_array<signed_char>
          (Mesh *this,Int ent_dim,Read<signed_char> *a,Int width,Omega_h_Op op)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  Read<signed_char> *pRVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar3;
  undefined4 in_register_00000034;
  Mesh *this_00;
  Read<signed_char> RVar4;
  Read<signed_char> local_d0;
  Dist local_c0;
  Omega_h_Op local_2c;
  Omega_h_Op op_local;
  Int width_local;
  Read<signed_char> *a_local;
  Mesh *pMStack_18;
  Int ent_dim_local;
  Mesh *this_local;
  
  this_00 = (Mesh *)CONCAT44(in_register_00000034,ent_dim);
  pRVar2 = (Read<signed_char> *)CONCAT44(in_register_0000000c,width);
  a_local._4_4_ = (Int)a;
  local_2c = op;
  _op_local = pRVar2;
  pMStack_18 = this_00;
  this_local = this;
  bVar1 = could_be_shared(this_00,a_local._4_4_);
  if (bVar1) {
    ask_dist(&local_c0,this_00,a_local._4_4_);
    Read<signed_char>::Read(&local_d0,pRVar2);
    Dist::exch_reduce<signed_char>
              ((Dist *)this,(Read<signed_char> *)&local_c0,(Int)&local_d0,local_2c);
    Read<signed_char>::~Read(&local_d0);
    Dist::~Dist(&local_c0);
    pvVar3 = extraout_RDX_00;
  }
  else {
    Read<signed_char>::Read((Read<signed_char> *)this,pRVar2);
    pvVar3 = extraout_RDX;
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<T> Mesh::reduce_array(Int ent_dim, Read<T> a, Int width, Omega_h_Op op) {
  if (!could_be_shared(ent_dim)) return a;
  return ask_dist(ent_dim).exch_reduce(a, width, op);
}